

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O0

int func_look(void)

{
  int iVar1;
  uint local_c;
  int hash;
  
  iVar1 = symhash();
  func_ptr = func_tbl[iVar1];
  while ((func_ptr != (t_func *)0x0 && (iVar1 = strcmp(symbol + 1,func_ptr->name), iVar1 != 0))) {
    func_ptr = func_ptr->next;
  }
  local_c = (uint)(func_ptr != (t_func *)0x0);
  return local_c;
}

Assistant:

int
func_look(void)
{
	int hash;

	/* search the function in the hash table */
	hash = symhash();
	func_ptr = func_tbl[hash];
	while (func_ptr) {
		if (!strcmp(&symbol[1], func_ptr->name))
			break;			
		func_ptr = func_ptr->next;
	}

	/* ok */
	if (func_ptr)
		return (1);

	/* didn't find a function with this name */
	return (0);
}